

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_writers.h
# Opt level: O0

void cppwinrt::write_component_tearoff(writer *w,TypeDef *type,bool has_base)

{
  TypeDef *pTVar1;
  bool bVar2;
  anon_class_8_1_89897ddb_conflict4 local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  char *local_48;
  char *format_1;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  char *local_28;
  char *format;
  TypeDef *pTStack_18;
  bool has_base_local;
  TypeDef *type_local;
  writer *w_local;
  
  format._7_1_ = has_base;
  pTStack_18 = type;
  type_local = (TypeDef *)w;
  bVar2 = has_fastabi(type);
  pTVar1 = type_local;
  if (bVar2) {
    if ((format._7_1_ & 1) == 0) {
      bVar2 = has_fastabi_tearoffs((writer *)type_local,pTStack_18);
      pTVar1 = type_local;
      if (bVar2) {
        local_48 = 
        "\n        int32_t query_interface_tearoff(guid const& id, void** result) const noexcept override\n        {%\n            return impl::error_no_interface;\n        }\n"
        ;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_58,
                   "\n        int32_t query_interface_tearoff(guid const& id, void** result) const noexcept override\n        {%\n            return impl::error_no_interface;\n        }\n"
                  );
        local_60 = bind<&cppwinrt::write_component_tearoff_interfaces,_const_winmd::reader::TypeDef_&>
                             (pTStack_18);
        writer_base<cppwinrt::writer>::
        write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                  ((writer_base<cppwinrt::writer> *)pTVar1,&local_58,&local_60);
      }
    }
    else {
      local_28 = 
      "\n        int32_t query_interface_tearoff(guid const& id, void** result) const noexcept override\n        {%\n            return B::query_interface_tearoff(id, result);\n        }\n"
      ;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_38,
                 "\n        int32_t query_interface_tearoff(guid const& id, void** result) const noexcept override\n        {%\n            return B::query_interface_tearoff(id, result);\n        }\n"
                );
      format_1 = (char *)bind<&cppwinrt::write_component_tearoff_interfaces,_const_winmd::reader::TypeDef_&>
                                   (pTStack_18);
      writer_base<cppwinrt::writer>::
      write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                ((writer_base<cppwinrt::writer> *)pTVar1,&local_38,
                 (anon_class_8_1_89897ddb_conflict4 *)&format_1);
    }
  }
  return;
}

Assistant:

static void write_component_tearoff(writer& w, TypeDef const& type, bool has_base)
    {
        if (!has_fastabi(type))
        {
            return;
        }

        if (has_base)
        {
            auto format = R"(
        int32_t query_interface_tearoff(guid const& id, void** result) const noexcept override
        {%
            return B::query_interface_tearoff(id, result);
        }
)";

            w.write(format, bind<write_component_tearoff_interfaces>(type));
        }
        else
        {
            if (!has_fastabi_tearoffs(w, type))
            {
                return;
            }

            auto format = R"(
        int32_t query_interface_tearoff(guid const& id, void** result) const noexcept override
        {%
            return impl::error_no_interface;
        }
)";

            w.write(format, bind<write_component_tearoff_interfaces>(type));
        }
    }